

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringEq
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StringEq *curr)

{
  undefined1 auVar1 [8];
  ulong uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  undefined1 local_130 [8];
  Literal right;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_110;
  size_t local_f8;
  char *pcStack_f0;
  anon_union_16_5_9943fe1e_for_Literal_0 local_e8;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  Literal left;
  undefined1 auStack_a8 [8];
  shared_ptr<wasm::GCData> leftData;
  long local_90;
  shared_ptr<wasm::GCData> rightData;
  Literal local_78;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_60;
  size_t local_48;
  char *pcStack_40;
  long local_38;
  
  visit((Flow *)&rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        this,*(Expression **)(curr + 0x18));
  if (pcStack_40 == (char *)0x0) {
    if (((long)local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
        (long)rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != 1) {
LAB_00192a9b:
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                    ,0x43,"const Literal &wasm::Flow::getSingleValue()");
    }
    ::wasm::Literal::Literal((Literal *)local_d0,&local_78);
    visit((Flow *)local_130,this,*(Expression **)(curr + 0x20));
    rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130;
    ::wasm::Literal::operator=(&local_78,&right);
    leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    auStack_a8 = (undefined1  [8])
                 local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_start;
    local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_110.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_110.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_110.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_110.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_110.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_110.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_a8);
    local_48 = local_f8;
    pcStack_40 = pcStack_f0;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_110);
    ::wasm::Literal::~Literal(&right);
    if (pcStack_40 == (char *)0x0) {
      if (((long)local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
          (long)rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != 1) goto LAB_00192a9b;
      ::wasm::Literal::Literal((Literal *)local_130,&local_78);
      ::wasm::Literal::getGCData();
      ::wasm::Literal::getGCData();
      if (*(int *)(curr + 0x10) == 0) {
        bVar6 = auStack_a8 == (undefined1  [8])0x0 && local_90 == 0;
        if (local_90 != 0 && auStack_a8 != (undefined1  [8])0x0) {
          bVar6 = SmallVector<wasm::Literal,_1UL>::operator==
                            ((SmallVector<wasm::Literal,_1UL> *)
                             &(((anon_union_16_5_9943fe1e_for_Literal_0 *)auStack_a8)->func).
                              super_IString.str._M_str,
                             (SmallVector<wasm::Literal,_1UL> *)(local_90 + 8));
        }
        local_e8.i32 = (int32_t)bVar6;
      }
      else {
        if (*(int *)(curr + 0x10) != 1) {
          ::wasm::handle_unreachable
                    ("bad op",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                     ,0x799);
        }
        if (auStack_a8 == (undefined1  [8])0x0 || local_90 == 0) {
          (*this->_vptr_ExpressionRunner[2])(this,"null ref");
        }
        auVar1 = auStack_a8;
        local_38 = local_90;
        if (((long)((long)(((pointer)((long)auStack_a8 + 0x30))->field_0).gcData.
                          super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
                   (((pointer)((long)auStack_a8 + 0x18))->type).id) >> 3) * -0x5555555555555555 +
            (long)(((anon_union_16_5_9943fe1e_for_Literal_0 *)auStack_a8)->gcData).
                  super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
            0) {
          uVar2 = 0;
        }
        else {
          left.type.id = (long)auStack_a8 + 0x10;
          uVar2 = 0;
          uVar5 = 1;
          do {
            if ((*(long *)(local_38 + 0x30) - *(long *)(local_38 + 0x28) >> 3) * -0x5555555555555555
                + *(long *)(local_38 + 8) == uVar2) {
LAB_00192a0c:
              local_e8.i32 = 1;
              goto LAB_00192a18;
            }
            lVar3 = ::wasm::Literal::getInteger();
            lVar4 = ::wasm::Literal::getInteger();
            if (lVar3 < lVar4) {
              local_e8.i32 = 0xffffffff;
              goto LAB_00192a18;
            }
            if (lVar4 < lVar3) goto LAB_00192a0c;
            uVar2 = (ulong)uVar5;
            uVar5 = uVar5 + 1;
          } while (((long)((long)(((pointer)((long)auVar1 + 0x30))->field_0).gcData.
                                 super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          - (((pointer)((long)auVar1 + 0x18))->type).id) >> 3) * -0x5555555555555555
                   + (long)(((anon_union_16_5_9943fe1e_for_Literal_0 *)auVar1)->gcData).
                           super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi != uVar2);
        }
        local_e8.i32 = -(uint)((*(long *)(local_38 + 0x30) - *(long *)(local_38 + 0x28) >> 3) *
                               -0x5555555555555555 + *(long *)(local_38 + 8) != uVar2);
      }
LAB_00192a18:
      local_d8 = 2;
      Flow::Flow(__return_storage_ptr__,(Literal *)&local_e8.func);
      ::wasm::Literal::~Literal((Literal *)&local_e8.func);
      if (rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      ::wasm::Literal::~Literal((Literal *)local_130);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
      ::wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,&local_78);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = local_48;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcStack_40;
    }
    ::wasm::Literal::~Literal((Literal *)local_d0);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
    ::wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,&local_78);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_60.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = local_48;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcStack_40;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_60);
  ::wasm::Literal::~Literal(&local_78);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringEq(StringEq* curr) {
    NOTE_ENTER("StringEq");
    Flow flow = visit(curr->left);
    if (flow.breaking()) {
      return flow;
    }
    auto left = flow.getSingleValue();
    flow = visit(curr->right);
    if (flow.breaking()) {
      return flow;
    }
    auto right = flow.getSingleValue();
    NOTE_EVAL2(left, right);
    auto leftData = left.getGCData();
    auto rightData = right.getGCData();
    int32_t result;
    switch (curr->op) {
      case StringEqEqual: {
        // They are equal if both are null, or both are non-null and equal.
        result =
          (!leftData && !rightData) ||
          (leftData && rightData && leftData->values == rightData->values);
        break;
      }
      case StringEqCompare: {
        if (!leftData || !rightData) {
          trap("null ref");
        }
        auto& leftValues = leftData->values;
        auto& rightValues = rightData->values;
        Index i = 0;
        while (1) {
          if (i == leftValues.size() && i == rightValues.size()) {
            // We reached the end, and they are equal.
            result = 0;
            break;
          } else if (i == leftValues.size()) {
            // The left string is short.
            result = -1;
            break;
          } else if (i == rightValues.size()) {
            result = 1;
            break;
          }
          auto left = leftValues[i].getInteger();
          auto right = rightValues[i].getInteger();
          if (left < right) {
            // The left character is lower.
            result = -1;
            break;
          } else if (left > right) {
            result = 1;
            break;
          } else {
            // Look further.
            i++;
          }
        }
        break;
      }
      default: {
        WASM_UNREACHABLE("bad op");
      }
    }
    return Literal(result);
  }